

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<unsigned_long_long,_QSslServerPrivate::SocketData> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::insert
          (Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *this,
          size_t i)

{
  long lVar1;
  byte bVar2;
  
  bVar2 = this->nextFree;
  if (bVar2 == this->allocated) {
    addStorage(this);
    bVar2 = this->nextFree;
  }
  lVar1 = (ulong)((uint)bVar2 * 8) * 5;
  this->nextFree = (this->entries->storage).data[lVar1];
  this->offsets[i] = bVar2;
  return (Node<unsigned_long_long,_QSslServerPrivate::SocketData> *)
         ((this->entries->storage).data + lVar1);
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }